

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

uint SimpleString::AtoU(char *str)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  byte *pbVar4;
  
  pbVar4 = (byte *)(str + 1);
  while ((uVar3 = (ulong)pbVar4[-1], uVar3 < 0x21 && ((0x100003e00U >> (uVar3 & 0x3f) & 1) != 0))) {
    pbVar4 = pbVar4 + 1;
  }
  uVar2 = 0;
  while ((byte)((char)uVar3 - 0x30U) < 10) {
    uVar2 = (uVar2 * 10 + (int)uVar3) - 0x30;
    bVar1 = *pbVar4;
    pbVar4 = pbVar4 + 1;
    uVar3 = (ulong)bVar1;
  }
  return uVar2;
}

Assistant:

unsigned SimpleString::AtoU(const char* str)
{
    while (isSpace(*str)) str++;

    unsigned result = 0;
    for(; isDigit(*str) && *str >= '0'; str++)
    {
        result *= 10;
        result += static_cast<unsigned>(*str - '0');
    }
    return result;
}